

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

Scal __thiscall LinearExpert::queryZ(LinearExpert *this,Z *z)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  ReturnType RVar5;
  type tVar6;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RSI;
  double *in_RDI;
  double dVar7;
  Z dzAux;
  Scal aux3;
  Z aux2;
  Scal aux1;
  Scal dof;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffe28;
  Scal SVar8;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pMVar9;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffe50;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *other;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_fffffffffffffe58;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  StorageBaseType *matrix;
  double *scalar;
  double local_48 [4];
  StorageBaseType local_28 [24];
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_10;
  
  matrix = local_28;
  local_10 = in_RSI;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50);
  pMVar9 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(in_RDI + 0x42);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe30,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffe28);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  scalar = local_48;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
  ::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe30,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffe28);
  dVar1 = in_RDI[0x11];
  dVar2 = in_RDI[0x23];
  iVar3 = *(int *)in_RDI;
  dVar7 = in_RDI[0x22] + in_RDI[0x11];
  dVar4 = ((dVar7 + 1.0) / dVar7) *
          (in_RDI[0x23] + in_RDI[0x11] + (double)*(int *)in_RDI +
          *(double *)(&DAT_003d5e50 + (ulong)(-(uint)(in_RDI[0x22] == 0.0) & 1) * 8));
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe30,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)in_stack_fffffffffffffe28);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  in_RDI[0x46] = RVar5;
  dVar7 = in_RDI[0x46];
  Eigen::operator*(scalar,matrix);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe30,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffe28);
  dVar1 = pow(dVar7 / dVar4 + 1.0,
              (((dVar2 + dVar1) - (double)iVar3) + 1.0 + (double)*(int *)in_RDI) * -0.5);
  in_RDI[0x2a] = dVar1;
  this_00 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_RDI[0x47];
  tVar6 = boost::math::tgamma_delta_ratio<double,double>
                    ((double)in_stack_fffffffffffffe30,(double)in_stack_fffffffffffffe28);
  other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
           *)((double)this_00 / tVar6);
  dVar1 = pow(2.0 / dVar4,(double)*(int *)in_RDI * 0.5);
  in_RDI[0x27] = (double)other * dVar1 * in_RDI[0x2a];
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator/(pMVar9,in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-(local_10,other);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe30,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
              *)in_stack_fffffffffffffe28);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe30,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)in_stack_fffffffffffffe28);
  pMVar9 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(1.0 / in_RDI[0x11]);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          dot<Eigen::Matrix<double,_1,1,0,_1,1>>(pMVar9,in_stack_fffffffffffffe28);
  in_RDI[0x31] = (double)pMVar9 + RVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=(this_00,(Scalar *)local_10);
  SVar8 = in_RDI[0x27];
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fc664);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fc6ac);
  return SVar8;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryZ( Z const &z )
{
    dz = z - Nu;
    pred_x = Lambda * dz + Mu;

    Scal dof = wSigma + Sh - d + 1.0;
    Scal aux1 = (wNu + Sh + 1.0) / (wNu + Sh) * (wSigma + Sh + d + (wNu == 0.0 ? 1.0 : 2.0));

    Z aux2 = invSigma * dz;
    dz_invSigma_dz = dz.dot( aux2 );
    Scal aux3 = 1.0 + dz_invSigma_dz / aux1;
    kappa = ( (dof+d)/aux1/aux3 ) * aux2;

    rbf_z = pow(aux3 , -0.5*(dof+d) );
    p_z_T = sqrtDetInvSigma / boost::math::tgamma_delta_ratio(0.5*dof, 0.5*d) * pow(2.0/aux1, 0.5*d) * rbf_z;

    Z dzAux = z - Sz/Sh;
    dGamma = varLambda * dzAux;
    gamma = 1.0/Sh + dzAux.dot( dGamma );
    dGamma *= 2.0;

    return p_z_T;
}